

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::NewFrame(FlowBuffer *this,int frame_length,bool chunked)

{
  undefined1 in_DL;
  undefined4 in_ESI;
  long in_RDI;
  FlowBuffer *unaff_retaddr;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar1;
  
  uVar1 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  NewMessage(unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x44) = 2;
  *(undefined4 *)(in_RDI + 0x1c) = in_ESI;
  *(byte *)(in_RDI + 0x20) = (byte)(uVar1 >> 0x18) & 1;
  *(undefined1 *)(in_RDI + 0x51) = 1;
  MarkOrCopyFrame((FlowBuffer *)CONCAT44(in_ESI,uVar1));
  return;
}

Assistant:

void FlowBuffer::NewFrame(int frame_length, bool chunked)
	{
	FlowBuffer::NewMessage();
	mode_ = FRAME_MODE;
	frame_length_ = frame_length;
	chunked_ = chunked;
	have_pending_request_ = true;
	MarkOrCopyFrame();
	}